

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

timestamp_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::timestamp_t,duckdb::QuantileIndirect<duckdb::date_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::date_t> *accessor)

{
  RESULT_TYPE RVar1;
  timestamp_t tVar2;
  timestamp_t hi;
  timestamp_t lo;
  unsigned_long local_38;
  unsigned_long local_30;
  timestamp_t local_28;
  timestamp_t local_20;
  
  local_38 = lidx;
  local_30 = hidx;
  if (lidx == hidx) {
    RVar1 = QuantileIndirect<duckdb::date_t>::operator()(accessor,&local_38);
    tVar2 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>((date_t)RVar1.days);
  }
  else {
    RVar1 = QuantileIndirect<duckdb::date_t>::operator()(accessor,&local_38);
    local_20 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>((date_t)RVar1.days);
    RVar1 = QuantileIndirect<duckdb::date_t>::operator()(accessor,&local_30);
    local_28 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>((date_t)RVar1.days);
    tVar2 = CastInterpolation::Interpolate<duckdb::timestamp_t>
                      (&local_20,
                       this->RN -
                       (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_28
                      );
  }
  return (timestamp_t)tVar2.value;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}